

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O0

void __thiscall Cmd::editMoveNextWord(Cmd *this,State *state)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  State *state_local;
  Cmd *this_local;
  
  while( true ) {
    uVar1 = state->pos;
    uVar2 = std::__cxx11::string::size();
    bVar4 = false;
    if (uVar1 < uVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)state);
      bVar4 = *pcVar3 == ' ';
    }
    if (!bVar4) break;
    state->pos = state->pos + 1;
  }
  while( true ) {
    uVar1 = state->pos;
    uVar2 = std::__cxx11::string::size();
    bVar4 = false;
    if (uVar1 < uVar2) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)state);
      bVar4 = *pcVar3 != ' ';
    }
    if (!bVar4) break;
    state->pos = state->pos + 1;
  }
  refreshLine(this,state);
  return;
}

Assistant:

void editMoveNextWord(State *state) {
		while (state->pos < state->buf.size() && state->buf[state->pos] == ' ')
			state->pos++;

		while (state->pos < state->buf.size() && state->buf[state->pos] != ' ')
			state->pos++;

		refreshLine(state);
	}